

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O1

TokenStream * __thiscall clara::detail::TokenStream::operator++(TokenStream *this)

{
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  __position._M_current =
       (this->m_tokenBuffer).
       super__Vector_base<clara::detail::Token,_std::allocator<clara::detail::Token>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->m_tokenBuffer).
                     super__Vector_base<clara::detail::Token,_std::allocator<clara::detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 3)
             * -0x3333333333333333) < 2) {
    pbVar1 = (this->it)._M_current;
    if (pbVar1 != (this->itEnd)._M_current) {
      (this->it)._M_current = pbVar1 + 1;
    }
    loadBuffer(this);
  }
  else {
    std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::_M_erase
              (&this->m_tokenBuffer,__position);
  }
  return this;
}

Assistant:

auto operator++() -> TokenStream & {
            if( m_tokenBuffer.size() >= 2 ) {
                m_tokenBuffer.erase( m_tokenBuffer.begin() );
            } else {
                if( it != itEnd )
                    ++it;
                loadBuffer();
            }
            return *this;
        }